

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::
SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
reserve(SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
        *this,size_t count)

{
  Candidate *__ptr;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  AlignedBuffer<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
  *pAVar4;
  size_t sVar5;
  
  if (count >> 0x3e == 0) {
    uVar3 = this->buffer_capacity;
    if (uVar3 < count) {
      uVar2 = 10;
      if (10 < uVar3) {
        uVar2 = uVar3;
      }
      do {
        uVar3 = uVar2;
        uVar2 = uVar3 * 2;
      } while (uVar3 < count);
      if (uVar3 < 0xb) {
        pAVar4 = &this->stack_storage;
      }
      else {
        pAVar4 = (AlignedBuffer<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                  *)malloc(uVar3 * 4);
      }
      if (pAVar4 == (AlignedBuffer<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                     *)0x0) goto LAB_007bb6c0;
      __ptr = (this->
              super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              ).ptr;
      if ((pAVar4 != (AlignedBuffer<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                      *)__ptr) &&
         (sVar1 = (this->
                  super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                  ).buffer_size, sVar1 != 0)) {
        sVar5 = 0;
        do {
          *(Candidate *)(pAVar4->aligned_char + sVar5 * 4) = __ptr[sVar5];
          sVar5 = sVar5 + 1;
        } while (sVar1 != sVar5);
      }
      if ((AlignedBuffer<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
           *)__ptr != &this->stack_storage) {
        free(__ptr);
      }
      (this->
      super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).
      ptr = (Candidate *)pAVar4;
      this->buffer_capacity = uVar3;
    }
    return;
  }
LAB_007bb6c0:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}